

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

void __thiscall
spvtools::val::ValidationState_t::RegisterQCOMImageProcessingTextureConsumer
          (ValidationState_t *this,uint32_t texture_id,Instruction *consumer0,Instruction *consumer1
          )

{
  bool bVar1;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar2;
  uint32_t local_44;
  _Node_iterator_base<unsigned_int,_false> local_40;
  undefined1 local_38;
  uint32_t local_2c;
  Instruction *local_28;
  Instruction *consumer1_local;
  Instruction *consumer0_local;
  ValidationState_t *pVStack_10;
  uint32_t texture_id_local;
  ValidationState_t *this_local;
  
  local_28 = consumer1;
  consumer1_local = consumer0;
  consumer0_local._4_4_ = texture_id;
  pVStack_10 = this;
  bVar1 = HasDecoration(this,texture_id,DecorationWeightTextureQCOM);
  if (((bVar1) || (bVar1 = HasDecoration(this,consumer0_local._4_4_,BlockMatchTextureQCOM), bVar1))
     || (bVar1 = HasDecoration(this,consumer0_local._4_4_,BlockMatchSamplerQCOM), bVar1)) {
    local_2c = Instruction::id(consumer1_local);
    pVar2 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert(&this->qcom_image_processing_consumers_,&local_2c);
    local_40._M_cur =
         (__node_type *)pVar2.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    local_38 = pVar2.second;
    if (local_28 != (Instruction *)0x0) {
      local_44 = Instruction::id(local_28);
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert(&this->qcom_image_processing_consumers_,&local_44);
    }
  }
  return;
}

Assistant:

void ValidationState_t::RegisterQCOMImageProcessingTextureConsumer(
    uint32_t texture_id, const Instruction* consumer0,
    const Instruction* consumer1) {
  if (HasDecoration(texture_id, spv::Decoration::WeightTextureQCOM) ||
      HasDecoration(texture_id, spv::Decoration::BlockMatchTextureQCOM) ||
      HasDecoration(texture_id, spv::Decoration::BlockMatchSamplerQCOM)) {
    qcom_image_processing_consumers_.insert(consumer0->id());
    if (consumer1) {
      qcom_image_processing_consumers_.insert(consumer1->id());
    }
  }
}